

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::MergeReturnPass::InsertAfterElement
          (MergeReturnPass *this,BasicBlock *element,BasicBlock *new_element,
          list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *list)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  
  for (p_Var2 = (list->
                super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      (p_Var2 != (_List_node_base *)list && ((BasicBlock *)p_Var2[1]._M_next != element));
      p_Var2 = (((_List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                  *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
  }
  if (p_Var2 == (_List_node_base *)list) {
    __assert_fail("pos != list->end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                  ,0x30a,
                  "void spvtools::opt::MergeReturnPass::InsertAfterElement(BasicBlock *, BasicBlock *, std::list<BasicBlock *> *)"
                 );
  }
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)new_element;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(list->
            super__List_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void MergeReturnPass::InsertAfterElement(BasicBlock* element,
                                         BasicBlock* new_element,
                                         std::list<BasicBlock*>* list) {
  auto pos = std::find(list->begin(), list->end(), element);
  assert(pos != list->end());
  ++pos;
  list->insert(pos, new_element);
}